

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O2

void __thiscall OutputFile::OutputFile(OutputFile *this)

{
  allocator<char> local_2a;
  allocator<char> local_29;
  
  (this->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->descendants).super__List_base<OutputFile_*,_std::allocator<OutputFile_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->version)._M_dataplus._M_p = (pointer)&(this->version).field_2;
  (this->version)._M_string_length = 0;
  (this->version).field_2._M_local_buf[0] = '\0';
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->eol,"\n",&local_29);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->keySeparator,"::",&local_2a);
  return;
}

Assistant:

OutputFile::OutputFile(void) : eol("\n"), keySeparator("::") {}